

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QWidget*,QRect>::emplace<QRect_const&>(QHash<QWidget*,QRect> *this,QWidget **key,QRect *args)

{
  Data *pDVar1;
  Data<QHashPrivate::Node<QWidget_*,_QRect>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  undefined1 auVar4 [16];
  QRect local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 != (Data *)0x0) {
    if (*(uint *)&pDVar1->ref < 2) {
      if (pDVar1->size < pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar3 = (piter)emplace_helper<QRect_const&>(this,key,args);
          return (iterator)pVar3;
        }
      }
      else {
        local_38._0_8_ = *(undefined8 *)args;
        local_38.x2.m_i = (args->x2).m_i;
        local_38.y2.m_i = (args->y2).m_i;
        pVar3 = (piter)QHash<QWidget_*,_QRect>::emplace_helper<QRect>
                                 ((QHash<QWidget_*,_QRect> *)this,key,&local_38);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          auVar4._0_8_ = pVar3.d;
          auVar4._8_8_ = pVar3.bucket;
          return (iterator)auVar4;
        }
      }
      goto LAB_006278b0;
    }
    if ((pDVar1 != (Data *)0x0) && (*(uint *)&pDVar1->ref != 0xffffffff)) {
      LOCK();
      pDVar1->ref = (RefCount)(*(uint *)&pDVar1->ref + 1);
      UNLOCK();
    }
  }
  pDVar2 = *(Data<QHashPrivate::Node<QWidget_*,_QRect>_> **)this;
  local_38._0_8_ = pDVar1;
  if ((pDVar2 == (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *)0x0) ||
     (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QRect>_>::detached(pDVar2);
    *(Data<QHashPrivate::Node<QWidget_*,_QRect>_> **)this = pDVar2;
  }
  pVar3 = (piter)emplace_helper<QRect_const&>(this,key,args);
  QHash<QWidget_*,_QRect>::~QHash((QHash<QWidget_*,_QRect> *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_006278b0:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }